

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

FrameDisplay * Js::JavascriptOperators::OP_LdHandlerScope(Var argThis,ScriptContext *scriptContext)

{
  RecyclableObject *hostObject;
  Recycler *alloc;
  FrameDisplay *pDisplay;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pDisplay = (FrameDisplay *)&NullFrameDisplay;
  if (argThis != (Var)0x0) {
    hostObject = (RecyclableObject *)
                 RootObjectBase::GetHostObject
                           (&((scriptContext->super_ScriptContextBase).globalObject)->
                             super_RootObjectBase);
    if ((hostObject == (RecyclableObject *)0x0) &&
       (hostObject = GlobalObject::GetDirectHostObject
                               ((scriptContext->super_ScriptContextBase).globalObject),
       hostObject == (RecyclableObject *)0x0)) {
      return (FrameDisplay *)&NullFrameDisplay;
    }
    local_50 = (undefined1  [8])&FrameDisplay::typeinfo;
    data.typeinfo = (type_info *)0x38;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4d342ea;
    data.filename._0_4_ = 0x1b99;
    alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
    pDisplay = (FrameDisplay *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
    pDisplay->tag = true;
    pDisplay->strictMode = false;
    pDisplay->length = 7;
    pDisplay->unused = 0;
    BuildHandlerScope(argThis,hostObject,pDisplay,scriptContext);
  }
  return pDisplay;
}

Assistant:

FrameDisplay * JavascriptOperators::OP_LdHandlerScope(Var argThis, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrObj_LdHandlerScope);
        // The idea here is to build a stack of nested scopes in the form of a JS array.
        //
        // The scope stack for an event handler looks like this:
        //
        // implicit "this"
        // implicit namespace parent scopes

        // Put the implicit "this"
        if (argThis != NULL)
        {
            RecyclableObject* hostObject = scriptContext->GetGlobalObject()->GetHostObject();
            if (hostObject == nullptr)
            {
                hostObject = scriptContext->GetGlobalObject()->GetDirectHostObject();
            }
            if (hostObject != nullptr)
            {
                uint16 length = 7;
                FrameDisplay *pDisplay =
                    RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                BuildHandlerScope(argThis, hostObject, pDisplay, scriptContext);
                return pDisplay;
            }
        }

        return const_cast<FrameDisplay *>(&Js::NullFrameDisplay);
        JIT_HELPER_END(ScrObj_LdHandlerScope);
    }